

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intpow.hpp
# Opt level: O2

unsigned_long
burst::detail::intpow_impl<unsigned_long,unsigned_long>(unsigned_long x,unsigned_long exponent)

{
  unsigned_long uVar1;
  unsigned_long uVar2;
  
  uVar1 = 1;
  for (; exponent != 0; exponent = exponent >> 1) {
    uVar2 = x;
    if ((exponent & 1) == 0) {
      uVar2 = 1;
    }
    uVar1 = uVar1 * uVar2;
    x = x * x;
  }
  return uVar1;
}

Assistant:

constexpr auto intpow_impl (Integer1 x, Integer2 exponent)
        {
            auto result = Integer1{1};

            while (exponent > 0)
            {
                if ((exponent & 0x01) != 0)
                {
                    result *= x;
                }

                x *= x;
                exponent >>= 1;
            }

            return result;
        }